

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O1

value constructor_metadata(constructor ctor)

{
  set __s;
  value v;
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  value *ppvVar4;
  value v_00;
  value *ppvVar5;
  size_t length;
  value pvVar6;
  value pvVar7;
  ulong uVar8;
  size_t *psVar9;
  
  v = class_visibility_value_pair(ctor->visibility);
  if (v == (value)0x0) {
    return (value)0x0;
  }
  pvVar1 = value_create_array((value *)0x0,ctor->count);
  pvVar7 = (value)0x0;
  if (((pvVar1 != (value)0x0) && (pvVar7 = pvVar1, ctor->count != 0)) &&
     (ppvVar2 = value_to_array(pvVar1), ctor->count != 0)) {
    psVar9 = &ctor[1].count;
    uVar8 = 0;
    do {
      pvVar3 = value_create_map((value *)0x0,2);
      ppvVar2[uVar8] = pvVar3;
      if (pvVar3 == (value)0x0) {
LAB_0011c46f:
        value_type_destroy(pvVar1);
        pvVar7 = (value)0x0;
        break;
      }
      ppvVar4 = value_to_map(pvVar3);
      __s = (set)psVar9[-1];
      v_00 = value_create_array((value *)0x0,2);
      pvVar3 = (value)0x0;
      if (v_00 != (value)0x0) {
        ppvVar5 = value_to_array(v_00);
        pvVar3 = value_create_string("name",4);
        *ppvVar5 = pvVar3;
        if (pvVar3 != (value)0x0) {
          length = strlen((char *)__s);
          pvVar6 = value_create_string((char *)__s,length);
          ppvVar5[1] = pvVar6;
          pvVar3 = v_00;
          if (pvVar6 != (value)0x0) goto LAB_0011c437;
        }
        value_type_destroy(v_00);
        pvVar3 = (value)0x0;
      }
LAB_0011c437:
      *ppvVar4 = pvVar3;
      if (pvVar3 == (value)0x0) goto LAB_0011c46f;
      pvVar3 = type_metadata((type_conflict)*psVar9);
      ppvVar4[1] = pvVar3;
      if (pvVar3 == (value)0x0) goto LAB_0011c46f;
      uVar8 = uVar8 + 1;
      psVar9 = psVar9 + 3;
    } while (uVar8 < ctor->count);
  }
  if (pvVar7 != (value)0x0) {
    pvVar1 = value_create_array((value *)0x0,2);
    if (pvVar1 == (value)0x0) {
      pvVar1 = (value)0x0;
      value_type_destroy((value)0x0);
      goto LAB_0011c4db;
    }
    ppvVar2 = value_to_array(pvVar1);
    pvVar3 = value_create_string("args",4);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      ppvVar2[1] = pvVar7;
      goto LAB_0011c4db;
    }
    value_type_destroy(pvVar1);
  }
  pvVar1 = (value)0x0;
LAB_0011c4db:
  if (pvVar1 != (value)0x0) {
    pvVar7 = value_create_map((value *)0x0,2);
    if (pvVar7 != (value)0x0) {
      ppvVar2 = value_to_map(pvVar7);
      *ppvVar2 = v;
      ppvVar2[1] = pvVar1;
      return pvVar7;
    }
    value_type_destroy(v);
    v = pvVar1;
  }
  value_type_destroy(v);
  return (value)0x0;
}

Assistant:

value constructor_metadata(constructor ctor)
{
	value vi, args, sig;
	value *sig_map;

	/* Create return array */
	vi = constructor_metadata_visibility(ctor);

	if (vi == NULL)
	{
		return NULL;
	}

	/* Create arguments map */
	args = constructor_metadata_args(ctor);

	if (args == NULL)
	{
		value_type_destroy(vi);

		return NULL;
	}

	/* Create signature map (return visibility + args) */
	sig = value_create_map(NULL, 2);

	if (sig == NULL)
	{
		value_type_destroy(vi);
		value_type_destroy(args);

		return NULL;
	}

	sig_map = value_to_map(sig);

	sig_map[0] = vi;
	sig_map[1] = args;

	return sig;
}